

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

bool P_BounceActor(AActor *mo,AActor *BlockingMobj,bool ontop)

{
  byte *pbVar1;
  double *pdVar2;
  double dVar3;
  ushort uVar4;
  uint uVar5;
  double dVar6;
  FState *pFVar7;
  int iVar8;
  FName local_34;
  FName names [3];
  
  if (BlockingMobj == (AActor *)0x0) {
    return false;
  }
  uVar5 = (BlockingMobj->flags2).Value;
  if (((int)uVar5 < 0) && (((BlockingMobj->flags7).Value & 0x800) != 0)) {
    return true;
  }
  if (mo == (AActor *)0x0) {
    return false;
  }
  uVar4 = (mo->BounceFlags).Value;
  if ((uVar4 & 0x10) != 0) goto LAB_004afaf3;
  if (((mo->flags).Value & 0x10000) != 0) {
    if ((((mo->flags2).Value & 0x100) == 0) || (((BlockingMobj->flags5).Value & 0x80000) != 0)) {
      if ((int)uVar5 < 0) goto LAB_004afaf3;
    }
    else if ((~uVar5 & 0x80008000) == 0 && ((mo->flags6).Value & 1) != 0) goto LAB_004afaf3;
  }
  if (BlockingMobj->player != (player_t *)0x0) {
    return false;
  }
  if (((BlockingMobj->flags3).Value & 0x2000) != 0) {
    return false;
  }
LAB_004afaf3:
  if ((0 < mo->bouncecount) && (iVar8 = mo->bouncecount + -1, mo->bouncecount = iVar8, iVar8 == 0))
  {
    return false;
  }
  uVar5 = (mo->flags7).Value;
  if ((uVar5 >> 0xe & 1) != 0) {
    (mo->target).field_0.p = BlockingMobj;
  }
  if ((short)uVar5 < 0) {
    (mo->master).field_0.p = BlockingMobj;
  }
  if ((uVar5 >> 0x10 & 1) != 0) {
    (mo->tracer).field_0.p = BlockingMobj;
  }
  if (!ontop) {
    AActor::AngleTo((AActor *)names,BlockingMobj,SUB81(mo,0));
    iVar8 = FRandom::operator()(&pr_bounce);
    dVar6 = AActor::VelXYToSpeed(mo);
    dVar3 = mo->wallbouncefactor;
    (mo->Angles).Yaw.Degrees = (double)(iVar8 % 0x10 + -8) + (double)names._0_8_;
    AActor::VelFromAngle(mo,dVar6 * dVar3);
    AActor::PlayBounceSound(mo,true);
    if (((mo->BounceFlags).Value & 0x4000) == 0) {
      return true;
    }
    names[0].Index = 0x92;
    names[1].Index = 4;
    names[2].Index = 0x96;
    uVar5 = (BlockingMobj->flags).Value;
    iVar8 = 3 - (uint)((uVar5 >> 0x13 & 1) != 0);
    if ((uVar5 & 4) == 0) {
      iVar8 = 2;
    }
    pFVar7 = AActor::FindState(mo,iVar8,names,false);
    if (pFVar7 != (FState *)0x0) {
      AActor::SetState(mo,pFVar7,false);
      return true;
    }
    return true;
  }
  dVar3 = (mo->Vel).Z;
  dVar3 = -2.0 / dVar3 + dVar3;
  if (((uVar4 & 0x1040) != 0) && ((mo->Vel).Z = dVar3, (uVar4 >> 0xc & 1) == 0)) {
    pbVar1 = (byte *)((long)&(mo->flags).Value + 2);
    *pbVar1 = *pbVar1 | 0x20;
    local_34.Index = 0x87;
    pFVar7 = AActor::FindState(mo,&local_34);
    AActor::SetState(mo,pFVar7,false);
    pbVar1 = (byte *)((long)&(mo->flags).Value + 2);
    *pbVar1 = *pbVar1 & 0xdf;
    return false;
  }
  (mo->Vel).Z = dVar3 * mo->bouncefactor;
  AActor::PlayBounceSound(mo,true);
  uVar4 = (mo->BounceFlags).Value;
  if ((uVar4 >> 0xc & 1) != 0) {
    dVar3 = (mo->Vel).Z;
    iVar8 = mo->Mass;
    dVar6 = AActor::GetGravity(mo);
    if (ABS(dVar3) < dVar6 * (double)iVar8 * 0.015625) {
      (mo->Vel).Z = 0.0;
      return true;
    }
    return true;
  }
  if ((uVar4 & 0x2020) != 0) {
    if (((mo->flags).Value & 0x200) != 0) {
      return true;
    }
    pdVar2 = &(mo->Vel).Z;
    if (*pdVar2 <= 3.0 && *pdVar2 != 3.0) {
      (mo->BounceFlags).Value = uVar4 & 0xef90;
      return true;
    }
    return true;
  }
  return true;
}

Assistant:

bool P_BounceActor(AActor *mo, AActor *BlockingMobj, bool ontop)
{
	//Don't go through all of this if the actor is reflective and wants things to pass through them.
	if (BlockingMobj && ((BlockingMobj->flags2 & MF2_REFLECTIVE) && (BlockingMobj->flags7 & MF7_THRUREFLECT))) return true;
	if (mo && BlockingMobj && ((mo->BounceFlags & BOUNCE_AllActors)
		|| ((mo->flags & MF_MISSILE) && (!(mo->flags2 & MF2_RIP) 
		|| (BlockingMobj->flags5 & MF5_DONTRIP) 
		|| ((mo->flags6 & MF6_NOBOSSRIP) && (BlockingMobj->flags2 & MF2_BOSS))) && (BlockingMobj->flags2 & MF2_REFLECTIVE))
		|| ((BlockingMobj->player == NULL) && (!(BlockingMobj->flags3 & MF3_ISMONSTER)))))
	{
		if (mo->bouncecount > 0 && --mo->bouncecount == 0) return false;

		if (mo->flags7 & MF7_HITTARGET)	mo->target = BlockingMobj;
		if (mo->flags7 & MF7_HITMASTER)	mo->master = BlockingMobj;
		if (mo->flags7 & MF7_HITTRACER)	mo->tracer = BlockingMobj;

		if (!ontop)
		{
			DAngle angle = BlockingMobj->AngleTo(mo) + ((pr_bounce() % 16) - 8);
			double speed = mo->VelXYToSpeed() * mo->wallbouncefactor; // [GZ] was 0.75, using wallbouncefactor seems more consistent
			mo->Angles.Yaw = angle;
			mo->VelFromAngle(speed);
			mo->PlayBounceSound(true);
			if (mo->BounceFlags & BOUNCE_UseBounceState)
			{
				FName names[] = { NAME_Bounce, NAME_Actor, NAME_Creature };
				FState *bouncestate;
				int count = 2;

				if ((BlockingMobj->flags & MF_SHOOTABLE) && !(BlockingMobj->flags & MF_NOBLOOD))
				{
					count = 3;
				}
				bouncestate = mo->FindState(count, names);
				if (bouncestate != NULL)
				{
					mo->SetState(bouncestate);
				}
			}
		}
		else
		{
			double dot = mo->Vel.Z;

			if (mo->BounceFlags & (BOUNCE_HereticType | BOUNCE_MBF))
			{
				mo->Vel.Z -= 2. / dot;
				if (!(mo->BounceFlags & BOUNCE_MBF)) // Heretic projectiles die, MBF projectiles don't.
				{
					mo->flags |= MF_INBOUNCE;
					mo->SetState(mo->FindState(NAME_Death));
					mo->flags &= ~MF_INBOUNCE;
					return false;
				}
				else
				{
					mo->Vel.Z *= mo->bouncefactor;
				}
			}
			else // Don't run through this for MBF-style bounces
			{
				// The reflected velocity keeps only about 70% of its original speed
				mo->Vel.Z = (mo->Vel.Z - 2. / dot) * mo->bouncefactor;
			}

			mo->PlayBounceSound(true);
			if (mo->BounceFlags & BOUNCE_MBF) // Bring it to rest below a certain speed
			{
				if (fabs(mo->Vel.Z) < mo->Mass * mo->GetGravity() / 64)
					mo->Vel.Z = 0;
			}
			else if (mo->BounceFlags & (BOUNCE_AutoOff | BOUNCE_AutoOffFloorOnly))
			{
				if (!(mo->flags & MF_NOGRAVITY) && (mo->Vel.Z < 3.))
					mo->BounceFlags &= ~BOUNCE_TypeMask;
			}
		}
		return true;
	}
	return false;
}